

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto::add_reserved_name(DescriptorProto *this,string *value)

{
  int iVar1;
  Arena *this_00;
  Rep *pRVar2;
  string *psVar3;
  int iVar4;
  
  pRVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
LAB_002ddd3f:
    internal::RepeatedPtrFieldBase::Reserve
              (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar4 + 1);
    pRVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    iVar4 = pRVar2->allocated_size;
  }
  else {
    iVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
    iVar4 = pRVar2->allocated_size;
    if (iVar1 < iVar4) {
      (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      psVar3 = (string *)pRVar2->elements[iVar1];
      goto LAB_002dddb8;
    }
    if (iVar4 == (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_) goto LAB_002ddd3f;
  }
  pRVar2->allocated_size = iVar4 + 1;
  this_00 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    psVar3 = (string *)operator_new(0x20);
  }
  else {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    psVar3 = (string *)
             internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       (&this_00->impl_,0x20,internal::arena_destruct_object<std::__cxx11::string>);
  }
  *(string **)psVar3 = psVar3 + 0x10;
  *(long *)(psVar3 + 8) = 0;
  psVar3[0x10] = (string)0x0;
  pRVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  iVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
  pRVar2->elements[iVar4] = psVar3;
LAB_002dddb8:
  std::__cxx11::string::_M_assign(psVar3);
  return;
}

Assistant:

inline void DescriptorProto::add_reserved_name(const std::string& value) {
  reserved_name_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:google.protobuf.DescriptorProto.reserved_name)
}